

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O2

void __thiscall helics::inproc::InprocComms::queue_tx_function(InprocComms *this)

{
  string *this_00;
  string_view copyToName;
  string_view copyToName_00;
  string_view copyToName_01;
  string_view copyFromName;
  string_view copyFromName_00;
  string_view copyFromName_01;
  __type _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  socklen_t sVar6;
  pointer pcVar7;
  sockaddr *__addr;
  ActionMessage *command;
  ActionMessage *command_00;
  sockaddr *__addr_00;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  __shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  BrokerBase *this_01;
  pair<helics::route_id,_helics::ActionMessage> *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view configureString;
  string_view configureString_00;
  string_view message;
  string_view brokerName;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view fmt;
  string_view brokerName_00;
  string_view brokerName_01;
  format_args args;
  route_id rid;
  shared_ptr<helics::CoreBroker> tbroker;
  string_view in_stack_fffffffffffffd88;
  long local_268;
  string_view newroute;
  map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  routes;
  shared_ptr<helics::Broker> brk;
  shared_ptr<helics::Core> core;
  string local_1f8;
  undefined1 local_1d8 [40];
  Time local_1b0;
  shared_ptr<helics::Broker> broker_1;
  shared_ptr<helics::Broker> broker;
  byte abStack_a8 [64];
  size_t sStack_68;
  size_t local_60;
  byte *local_58;
  undefined8 local_50;
  pointer pbStack_48;
  pointer local_40;
  pointer pbStack_38;
  
  local_1b0.internalTimeCode = (baseType)&(this->super_CommsInterface).localTargetAddress;
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(this->super_CommsInterface).name,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b0.internalTimeCode);
  if (!_Var1) {
    if ((this->super_CommsInterface).brokerName._M_string_length == 0) {
      copyFromName_01._M_len._4_4_ = routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      copyFromName_01._M_len._0_4_ = routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      copyFromName_01._M_str = (char *)routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ;
      copyToName_01._M_str = (char *)routes._M_t._M_impl._0_8_;
      copyToName_01._M_len = (size_t)newroute._M_str;
      bVar2 = BrokerFactory::copyBrokerIdentifier(copyFromName_01,copyToName_01);
    }
    else {
      copyFromName._M_len._4_4_ = routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      copyFromName._M_len._0_4_ = routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      copyFromName._M_str = (char *)routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      copyToName._M_str = (char *)routes._M_t._M_impl._0_8_;
      copyToName._M_len = (size_t)newroute._M_str;
      bVar2 = CoreFactory::copyCoreIdentifier(copyFromName,copyToName);
      if (bVar2) goto LAB_002128c2;
      copyFromName_00._M_len._4_4_ = routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      copyFromName_00._M_len._0_4_ = routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      copyFromName_00._M_str = (char *)routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ;
      copyToName_00._M_str = (char *)routes._M_t._M_impl._0_8_;
      copyToName_00._M_len = (size_t)newroute._M_str;
      bVar2 = BrokerFactory::copyBrokerIdentifier(copyFromName_00,copyToName_00);
    }
    if (!bVar2) {
      CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
      CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
      return;
    }
  }
LAB_002128c2:
  iVar4 = 0;
  CommsInterface::setRxStatus(&this->super_CommsInterface,CONNECTED);
  tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &(this->super_CommsInterface).brokerName;
  if (((this->super_CommsInterface).brokerName._M_string_length != 0) ||
     (((this->super_CommsInterface).brokerTargetAddress._M_string_length != 0 &&
      (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
       _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_CommsInterface).brokerTargetAddress),
      (this->super_CommsInterface).brokerName._M_string_length != 0)))) {
    local_268 = 0;
    do {
      if (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) goto LAB_00212bb4;
      brokerName_00._M_str = (char *)(this->super_CommsInterface).brokerName._M_string_length;
      brokerName_00._M_len =
           (size_t)&broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
      BrokerFactory::findBroker(brokerName_00);
      std::dynamic_pointer_cast<helics::CoreBroker,helics::Broker>(&broker_1);
      std::__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if ((this->super_CommsInterface).autoBroker == true) {
          pcVar7 = (this->super_CommsInterface).brokerName._M_dataplus._M_p;
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
          configureString._M_str =
               (char *)(this->super_CommsInterface).brokerInitString._M_string_length;
          configureString._M_len = (size_t)pcVar7;
          brokerName._M_str = (char *)(this->super_CommsInterface).brokerName._M_string_length;
          brokerName._M_len = 0x12;
          BrokerFactory::create((CoreType)&routes,brokerName,configureString);
          sVar6 = (socklen_t)pcVar7;
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                          routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)routes._M_t._M_impl._0_8_;
          routes._M_t._M_impl._0_8_ = 0;
          routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&broker_1;
          std::__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker_1);
          iVar3 = (int)pbVar9;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &routes._M_t._M_impl.super__Rb_tree_header);
          CoreBroker::connect(tbroker.
                              super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,iVar3,__addr,sVar6);
          bVar2 = true;
        }
        else if ((this->super_CommsInterface).connectionTimeout.__r < local_268) {
          CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
          CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
          bVar2 = false;
        }
        else {
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&DAT_000000c8;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&broker_1);
          local_268 = local_268 + 200;
          bVar2 = true;
        }
      }
      else {
        iVar3 = (*((tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Broker)._vptr_Broker[7])();
        bVar2 = true;
        if (((char)iVar3 == '\0') && ((this->super_CommsInterface).observer == false)) {
          if (iVar4 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &broker_1,"broker is not open to new federates ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00);
            message._M_str =
                 (char *)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
            message._M_len =
                 (size_t)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            CommsInterface::logError(&this->super_CommsInterface,message);
            std::__cxx11::string::~string((string *)&broker_1);
          }
          iVar3 = iVar4 + 1;
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&broker_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (iVar4 < 2) {
            if (iVar4 == 0) {
              broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&DAT_000000c8;
              std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&broker_1);
            }
            BrokerFactory::cleanUpBrokers((milliseconds)0xc8);
            local_268 = local_268 + 200;
            iVar4 = iVar3;
            bVar2 = true;
            if (local_268 <= (this->super_CommsInterface).connectionTimeout.__r) goto LAB_00212b54;
            CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
            CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
          }
          else {
            CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
            CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
          }
          iVar4 = iVar3;
          bVar2 = false;
        }
      }
LAB_00212b54:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    } while (bVar2);
    goto LAB_00213104;
  }
  if ((this->super_CommsInterface).serverMode == false) {
    lVar8 = 0;
    while (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0) {
      BrokerFactory::findJoinableBrokerOfType((CoreType)&broker_1);
      std::dynamic_pointer_cast<helics::CoreBroker,helics::Broker>(&broker);
      std::__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if ((this->super_CommsInterface).autoBroker == true) {
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
          configureString_00._M_str =
               (char *)(this->super_CommsInterface).brokerInitString._M_string_length;
          configureString_00._M_len = (size_t)"";
          sVar6 = 0x35f754;
          BrokerFactory::create((CoreType)&routes,(string_view)ZEXT816(0x12),configureString_00);
          broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
          broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)routes._M_t._M_impl._0_8_;
          routes._M_t._M_impl._0_8_ = 0;
          routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          routes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          p_Var10 = (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker;
          std::__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker);
          iVar4 = (int)p_Var10;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &routes._M_t._M_impl.super__Rb_tree_header);
          CoreBroker::connect(tbroker.
                              super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,iVar4,__addr_00,sVar6);
        }
        else {
          if ((this->super_CommsInterface).connectionTimeout.__r < lVar8) {
            CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
            CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00213104;
          }
          broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&DAT_000000c8;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&broker);
          lVar8 = lVar8 + 200;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
LAB_00212bb4:
    _Var1 = std::operator==(&((tbroker.
                               super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_BrokerBase).identifier,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0.internalTimeCode);
    if (_Var1) {
      message_00._M_str = "broker == target";
      message_00._M_len = 0x10;
      CommsInterface::logError(&this->super_CommsInterface,message_00);
    }
    iVar4 = (*((tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Broker)._vptr_Broker[7])();
    if (((char)iVar4 == '\0') && ((this->super_CommsInterface).observer == false)) {
      message_01._M_str = "broker is not open to new federates";
      message_01._M_len = 0x23;
      CommsInterface::logError(&this->super_CommsInterface,message_01);
    }
  }
  else if (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0) goto LAB_00212bb4;
  CommsInterface::setTxStatus(&this->super_CommsInterface,CONNECTED);
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &routes._M_t._M_impl.super__Rb_tree_header._M_header;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00212c5b:
  rid.rid = -0x4d3263e0;
  broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9aac0f0000000000;
  abStack_a8[0x38] = 0;
  abStack_a8[0x39] = 0;
  abStack_a8[0x3a] = 0;
  abStack_a8[0x3b] = 0;
  abStack_a8[0x3c] = 0;
  abStack_a8[0x3d] = 0;
  abStack_a8[0x3e] = 0;
  abStack_a8[0x3f] = 0;
  sStack_68 = 0;
  abStack_a8[0x28] = 0;
  abStack_a8[0x29] = 0;
  abStack_a8[0x2a] = 0;
  abStack_a8[0x2b] = 0;
  abStack_a8[0x2c] = 0;
  abStack_a8[0x2d] = 0;
  abStack_a8[0x2e] = 0;
  abStack_a8[0x2f] = 0;
  abStack_a8[0x30] = 0;
  abStack_a8[0x31] = 0;
  abStack_a8[0x32] = 0;
  abStack_a8[0x33] = 0;
  abStack_a8[0x34] = 0;
  abStack_a8[0x35] = 0;
  abStack_a8[0x36] = 0;
  abStack_a8[0x37] = 0;
  abStack_a8[0x18] = 0;
  abStack_a8[0x19] = 0;
  abStack_a8[0x1a] = 0;
  abStack_a8[0x1b] = 0;
  abStack_a8[0x1c] = 0;
  abStack_a8[0x1d] = 0;
  abStack_a8[0x1e] = 0;
  abStack_a8[0x1f] = 0;
  abStack_a8[0x20] = 0;
  abStack_a8[0x21] = 0;
  abStack_a8[0x22] = 0;
  abStack_a8[0x23] = 0;
  abStack_a8[0x24] = 0;
  abStack_a8[0x25] = 0;
  abStack_a8[0x26] = 0;
  abStack_a8[0x27] = 0;
  abStack_a8[8] = 0;
  abStack_a8[9] = 0;
  abStack_a8[10] = 0;
  abStack_a8[0xb] = 0;
  abStack_a8[0xc] = 0;
  abStack_a8[0xd] = 0;
  abStack_a8[0xe] = 0;
  abStack_a8[0xf] = 0;
  abStack_a8[0x10] = 0;
  abStack_a8[0x11] = 0;
  abStack_a8[0x12] = 0;
  abStack_a8[0x13] = 0;
  abStack_a8[0x14] = 0;
  abStack_a8[0x15] = 0;
  abStack_a8[0x16] = 0;
  abStack_a8[0x17] = 0;
  abStack_a8[0] = 0;
  abStack_a8[1] = 0;
  abStack_a8[2] = 0;
  abStack_a8[3] = 0;
  abStack_a8[4] = 0;
  abStack_a8[5] = 0;
  abStack_a8[6] = 0;
  abStack_a8[7] = 0;
  local_60 = 0x40;
  local_58 = abStack_a8;
  local_40 = (pointer)0x0;
  pbStack_38 = (pointer)0x0;
  local_50._0_1_ = false;
  local_50._1_1_ = false;
  local_50._2_1_ = false;
  local_50._3_1_ = '\0';
  local_50._4_4_ = 0;
  pbStack_48 = (pointer)0x0;
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::pop((pair<helics::route_id,_helics::ActionMessage> *)&broker_1,
        &(this->super_CommsInterface).txQueue);
  local_1f8._M_string_length = (size_type)&rid;
  local_1f8._M_dataplus._M_p = (pointer)&broker;
  std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
            ((tuple<helics::route_id&,helics::ActionMessage&> *)&local_1f8,
             (pair<helics::route_id,_helics::ActionMessage> *)&broker_1);
  ActionMessage::~ActionMessage
            ((ActionMessage *)
             &broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((((int)broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr == -60000
        ) || ((int)broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              0x1000ea60)) ||
      ((int)broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 60000))
     && (rid.rid == -1)) {
    if (broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ == 0xe9)
    {
      newroute._M_len = sStack_68;
      newroute._M_str = (char *)local_58;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&broker_1,(basic_string_view<char,_std::char_traits<char>_> *)&newroute,
                 (allocator<char> *)&local_1f8);
      CoreFactory::findCore(in_stack_fffffffffffffd88);
      std::__cxx11::string::~string((string *)&broker_1);
      if (core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        bVar2 = false;
      }
      else {
        std::dynamic_pointer_cast<helics::CommonCore,helics::Core>
                  ((shared_ptr<helics::Core> *)&broker_1);
        bVar2 = broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0;
        if (bVar2) {
          local_1f8._M_dataplus._M_p._0_4_ = 0x9aac0f00;
          std::
          _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
          ::_M_emplace_unique<helics::route_id,std::shared_ptr<helics::CommonCore>>
                    ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                      *)&routes,(route_id *)&local_1f8,(shared_ptr<helics::CommonCore> *)&broker_1);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&broker_1,(basic_string_view<char,_std::char_traits<char>_> *)&newroute,
                 (allocator<char> *)&local_1f8);
      brokerName_01._M_str =
           (char *)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      brokerName_01._M_len = (size_t)&brk;
      BrokerFactory::findBroker(brokerName_01);
      std::__cxx11::string::~string((string *)&broker_1);
      if (brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
LAB_00213014:
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"unable to establish Route to ",
                     (allocator<char> *)&stack0xfffffffffffffd97);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_1d8,
                     (basic_string_view<char,_std::char_traits<char>_> *)&newroute,
                     (allocator<char> *)&stack0xfffffffffffffd96);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &broker_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
          message_04._M_str =
               (char *)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
          message_04._M_len =
               (size_t)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
          CommsInterface::logError(&this->super_CommsInterface,message_04);
          std::__cxx11::string::~string((string *)&broker_1);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
        }
      }
      else {
        std::dynamic_pointer_cast<helics::CoreBroker,helics::Broker>(&broker_1);
        if (broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          goto LAB_00213014;
        }
        local_1f8._M_dataplus._M_p._0_4_ = 0x9aac0f00;
        std::
        _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
        ::_M_emplace_unique<helics::route_id,std::shared_ptr<helics::CoreBroker>>
                  ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                    *)&routes,(route_id *)&local_1f8,(shared_ptr<helics::CoreBroker> *)&broker_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else if (broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ ==
             0xf4) {
      broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,0x9aac0f00);
      std::
      _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
      ::erase(&routes._M_t,(key_type *)&broker_1);
    }
    else {
      if (broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ !=
          0x16570bf) {
        if (broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ !=
            0x9db) goto LAB_00212d77;
        ActionMessage::~ActionMessage((ActionMessage *)&broker);
        std::
        _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
        ::clear(&routes._M_t);
        broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2> *)&broker_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        CommsInterface::setTxStatus(&this->super_CommsInterface,TERMINATED);
        std::
        _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
        ::~_Rb_tree(&routes._M_t);
LAB_00213104:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return;
      }
      CommsInterface::setRxStatus(&this->super_CommsInterface,TERMINATED);
    }
  }
  else if (rid.rid == 0) {
    if (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prettyPrintString_abi_cxx11_(&local_1f8,(helics *)&broker,command);
      local_1d8._0_8_ = local_1f8._M_dataplus._M_p;
      local_1d8._8_8_ = local_1f8._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x4c;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_1d8;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&broker_1,
                 (v11 *)
                 "message directed to broker of comm system with no broker, message dropped {}",fmt,
                 args);
      message_02._M_str =
           (char *)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      message_02._M_len =
           (size_t)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      CommsInterface::logWarning(&this->super_CommsInterface,message_02);
      this_02 = (pair<helics::route_id,_helics::ActionMessage> *)&broker_1;
LAB_00212e90:
      std::__cxx11::string::~string((string *)this_02);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    else {
      BrokerBase::addActionMessage
                (&(tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->super_BrokerBase,(ActionMessage *)&broker);
    }
  }
  else {
LAB_00212d77:
    iVar5 = std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
            ::find(&routes._M_t,&rid);
    if ((_Rb_tree_header *)iVar5._M_node == &routes._M_t._M_impl.super__Rb_tree_header) {
      if (tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        bVar2 = isIgnoreableCommand((ActionMessage *)&broker);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"unknown route, message dropped ",
                     (allocator<char> *)&newroute);
          prettyPrintString_abi_cxx11_((string *)local_1d8,(helics *)&broker,command_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &broker_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
          message_03._M_str =
               (char *)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
          message_03._M_len =
               (size_t)broker_1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
          CommsInterface::logWarning(&this->super_CommsInterface,message_03);
          std::__cxx11::string::~string((string *)&broker_1);
          this_02 = (pair<helics::route_id,_helics::ActionMessage> *)local_1d8;
          goto LAB_00212e90;
        }
        goto LAB_002130a5;
      }
      this_01 = &(tbroker.super___shared_ptr<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->super_BrokerBase;
    }
    else {
      this_01 = (BrokerBase *)iVar5._M_node[1]._M_parent;
    }
    BrokerBase::addActionMessage(this_01,(ActionMessage *)&broker);
  }
LAB_002130a5:
  ActionMessage::~ActionMessage((ActionMessage *)&broker);
  goto LAB_00212c5b;
}

Assistant:

void InprocComms::queue_tx_function()
    {
        using std::chrono::milliseconds;
        // make sure the link to the localTargetAddress is in place
        if (name != localTargetAddress) {
            if (!brokerName.empty()) {
                if (!CoreFactory::copyCoreIdentifier(name, localTargetAddress)) {
                    if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                        setRxStatus(ConnectionStatus::ERRORED);
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
            } else {
                if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                    setRxStatus(ConnectionStatus::ERRORED);
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
        }
        setRxStatus(ConnectionStatus::CONNECTED);
        std::shared_ptr<CoreBroker> tbroker;

        if (brokerName.empty()) {
            if (!brokerTargetAddress.empty()) {
                brokerName = brokerTargetAddress;
            }
        }

        if (!brokerName.empty()) {
            milliseconds totalSleep(0);
            int ecount{0};
            while (!tbroker) {
                auto broker = BrokerFactory::findBroker(brokerName);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, brokerName, brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                } else {
                    if (!tbroker->isOpenToNewFederates() && !observer) {
                        ++ecount;
                        if (ecount == 1) {
                            logError("broker is not open to new federates " + brokerName);
                        }
                        tbroker = nullptr;
                        broker = nullptr;
                        if (ecount >= 3) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        if (ecount == 1) {
                            std::this_thread::sleep_for(milliseconds(200));
                        }
                        BrokerFactory::cleanUpBrokers(milliseconds(200));
                        totalSleep += milliseconds(200);
                        if (totalSleep > milliseconds(connectionTimeout)) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                    }
                }
            }
        } else if (!serverMode) {
            milliseconds totalSleep(0);
            while (!tbroker) {
                auto broker = BrokerFactory::findJoinableBrokerOfType(CoreType::INPROC);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, "", brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                }
            }
        }
        if (tbroker) {
            if (tbroker->getIdentifier() == localTargetAddress) {
                logError("broker == target");
            }
            if (!tbroker->isOpenToNewFederates() && !observer) {
                logError("broker is not open to new federates");
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        std::map<route_id, std::shared_ptr<BrokerBase>> routes;
        bool haltLoop{false};
        while (!haltLoop) {
            route_id rid;
            ActionMessage cmd;

            std::tie(rid, cmd) = txQueue.pop();
            bool processed = false;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            auto newroute = cmd.payload.to_string();
                            bool foundRoute = false;
                            auto core = CoreFactory::findCore(std::string(newroute));
                            if (core) {
                                auto tcore = std::dynamic_pointer_cast<CommonCore>(core);
                                if (tcore) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(tcore));
                                    foundRoute = true;
                                }
                            }
                            auto brk = BrokerFactory::findBroker(std::string(newroute));

                            if (brk) {
                                auto cbrk = std::dynamic_pointer_cast<CoreBroker>(brk);
                                if (cbrk) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(cbrk));
                                    foundRoute = true;
                                }
                            }
                            if (!foundRoute) {
                                logError(std::string("unable to establish Route to ") +
                                         std::string(newroute));
                            }
                            processed = true;
                        } break;
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            processed = true;
                            break;
                        case CLOSE_RECEIVER:
                            setRxStatus(ConnectionStatus::TERMINATED);
                            processed = true;
                            break;
                        case DISCONNECT:
                            haltLoop = true;
                            continue;
                    }
                }
            }
            if (processed) {
                continue;
            }

            if (rid == parent_route_id) {
                if (tbroker) {
                    tbroker->addActionMessage(std::move(cmd));
                } else {
                    logWarning(fmt::format(
                        "message directed to broker of comm system with no broker, message dropped {}",
                        prettyPrintString(cmd)));
                }
            } else {
                auto rt_find = routes.find(rid);
                if (rt_find != routes.end()) {
                    rt_find->second->addActionMessage(std::move(cmd));
                } else {
                    if (tbroker) {
                        tbroker->addActionMessage(std::move(cmd));
                    } else {
                        if (!isIgnoreableCommand(cmd)) {
                            logWarning(std::string("unknown route, message dropped ") +
                                       prettyPrintString(cmd));
                        }
                    }
                }
            }
        }  // while (!haltLoop)

        routes.clear();
        tbroker = nullptr;

        setTxStatus(ConnectionStatus::TERMINATED);
    }